

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

void luaC_fullgc(lua_State *L,int isemergency)

{
  lu_byte lVar1;
  global_State *g;
  
  g = L->l_G;
  lVar1 = g->gckind;
  if (isemergency == 0) {
    g->gckind = '\0';
    callallpendingfinalizers(L,1);
    if (g->gckind != '\x02') goto LAB_00109dd0;
  }
  else {
    g->gckind = '\x01';
LAB_00109dd0:
    if (1 < g->gcstate) goto LAB_00109ddf;
  }
  entersweep(L);
LAB_00109ddf:
  luaC_runtilstate(L,0x20);
  luaC_runtilstate(L,-0x21);
  luaC_runtilstate(L,0x20);
  if (lVar1 == '\x02') {
    luaC_runtilstate(L,1);
  }
  g->gckind = lVar1;
  setpause(g,g->GCdebt + g->totalbytes);
  if (isemergency != 0) {
    return;
  }
  callallpendingfinalizers(L,1);
  return;
}

Assistant:

void luaC_fullgc (lua_State *L, int isemergency) {
  global_State *g = G(L);
  int origkind = g->gckind;
  lua_assert(origkind != KGC_EMERGENCY);
  if (isemergency)  /* do not run finalizers during emergency GC */
    g->gckind = KGC_EMERGENCY;
  else {
    g->gckind = KGC_NORMAL;
    callallpendingfinalizers(L, 1);
  }
  if (keepinvariant(g)) {  /* may there be some black objects? */
    /* must sweep all objects to turn them back to white
       (as white has not changed, nothing will be collected) */
    entersweep(L);
  }
  /* finish any pending sweep phase to start a new cycle */
  luaC_runtilstate(L, bitmask(GCSpause));
  luaC_runtilstate(L, ~bitmask(GCSpause));  /* start new collection */
  luaC_runtilstate(L, bitmask(GCSpause));  /* run entire collection */
  if (origkind == KGC_GEN) {  /* generational mode? */
    /* generational mode must be kept in propagate phase */
    luaC_runtilstate(L, bitmask(GCSpropagate));
  }
  g->gckind = origkind;
  setpause(g, gettotalbytes(g));
  if (!isemergency)   /* do not run finalizers during emergency GC */
    callallpendingfinalizers(L, 1);
}